

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.c
# Opt level: O0

_Bool ssh1_common_get_specials(PacketProtocolLayer *ppl,add_special_fn_t add_special,void *ctx)

{
  bool bVar1;
  void *ctx_local;
  add_special_fn_t add_special_local;
  PacketProtocolLayer *ppl_local;
  
  bVar1 = (ppl->remote_bugs & 1) == 0;
  if (bVar1) {
    (*add_special)(ctx,"IGNORE message",SS_NOP,0);
  }
  return bVar1;
}

Assistant:

bool ssh1_common_get_specials(
    PacketProtocolLayer *ppl, add_special_fn_t add_special, void *ctx)
{
    /*
     * Don't bother offering IGNORE if we've decided the remote
     * won't cope with it, since we wouldn't bother sending it if
     * asked anyway.
     */
    if (!(ppl->remote_bugs & BUG_CHOKES_ON_SSH1_IGNORE)) {
        add_special(ctx, "IGNORE message", SS_NOP, 0);
        return true;
    }

    return false;
}